

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvr.c
# Opt level: O2

int cvrMain(int argc,char **argv)

{
  int iVar1;
  err_t code;
  bool_t bVar2;
  u32 uVar3;
  int iVar4;
  err_t eVar5;
  cmd_sig_t *sig;
  size_t sVar6;
  char *pcVar7;
  octet *poVar8;
  octet *buf;
  size_t *date;
  char *sig_name;
  ulong uVar9;
  err_t eVar10;
  char **ppcVar11;
  cmd_sig_t *pcVar12;
  size_t sig_len;
  size_t offset;
  size_t ring_len;
  size_t cert_len_1;
  cmd_sig_t *local_60;
  size_t ring_len_2;
  size_t sig_len_4;
  size_t local_48;
  size_t offset_1;
  octet local_36 [6];
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  cvr init -pass <schema> <privkeya> <certa> <ring>\n    init <ring> on behalf of the holder of <privkeya>/<certa>\n  cvr add -pass <schema> <privkeya> <certa> <cert> <ring>\n    add <cert> to <ring>\n  cvr del -pass <schema> <privkeya> <certa> <cert> <ring>\n    remove <cert> from <ring>\n  cvr val <certa> <ring>\n    validate <ring> using <certa> as an anchor\n  cvr find <ring> <cert>\n    find <cert> in <ring>\n  cvr extr -cert<nnn> <ring> <obj_file>\n    extract object from <ring> and store it in <obj_file>\n      -cert<nnn> -- <nnn>th certificate\n        \\remark certificates are numbered from zero\n      -certa -- holder\'s certificate\n  cvr print [-certc] <ring>\n    print <ring> info: all fields or a specific field\n      -certc -- number of certificates\n  .\n"
           ,"cvr","manage certificate rings");
    return -1;
  }
  iVar4 = -1;
  iVar1 = strCmp(argv[1],"init");
  if (iVar1 == 0) {
    code = cmdStDo(8);
    if (((code == 0) && (code = 0x25b, argc == 7)) && (iVar1 = strCmp(argv[2],"-pass"), iVar1 == 0))
    {
      ppcVar11 = argv + 4;
      code = cmdFileValExist(2,ppcVar11);
      if (code == 0) {
        code = cmdFileValNotExist(1,argv + 6);
        if ((code == 0) && (code = cmdPwdRead((cmd_pwd_t *)&sig_len,argv[3]), code == 0)) {
          ring_len = 0;
          code = cmdPrivkeyRead((octet *)0x0,&ring_len,*ppcVar11,(cmd_pwd_t)sig_len);
          if (code != 0) goto LAB_0010a1f1;
          sig = (cmd_sig_t *)blobCreate(ring_len);
          if (sig == (cmd_sig_t *)0x0) goto LAB_0010a80d;
          code = cmdPrivkeyRead((octet *)sig,(size_t *)0x0,*ppcVar11,(cmd_pwd_t)sig_len);
          cmdPwdClose((cmd_pwd_t)sig_len);
          if ((code == 0) && (code = cmdFileWrite(argv[6],(void *)0x0,0), code == 0)) {
            bVar2 = tmDate2((octet *)&offset);
            if (bVar2 == 0) {
LAB_0010a96e:
              blobClose(sig);
              code = 0x68;
              goto LAB_0010a48d;
            }
            pcVar7 = argv[5];
            sig_name = argv[6];
            date = &offset;
LAB_00109ed7:
            code = cmdSigSign(sig_name,sig_name,pcVar7,(octet *)date,sig->sig,ring_len);
          }
          goto LAB_0010a3d8;
        }
      }
    }
  }
  else {
    iVar1 = strCmp(argv[1],"add");
    if (iVar1 == 0) {
      code = cmdStDo(8);
      if (((code == 0) && (code = 0x25b, argc == 8)) &&
         (iVar1 = strCmp(argv[2],"-pass"), iVar1 == 0)) {
        ppcVar11 = argv + 4;
        code = cmdFileValExist(4,ppcVar11);
        if ((code == 0) && (code = cmdPwdRead((cmd_pwd_t *)&sig_len,argv[3]), code == 0)) {
          ring_len = 0;
          code = cmdPrivkeyRead((octet *)0x0,&ring_len,*ppcVar11,(cmd_pwd_t)sig_len);
          if ((code != 0) ||
             ((code = cmdFileReadAll((void *)0x0,&offset,argv[5]), code != 0 ||
              (code = cmdFileReadAll((void *)0x0,&cert_len_1,argv[6]), code != 0))))
          goto LAB_0010a1f1;
          sig = (cmd_sig_t *)
                blobCreate(cert_len_1 + ring_len + CONCAT44(offset._4_4_,(uint)offset) + 0x758);
          if (sig == (cmd_sig_t *)0x0) {
LAB_0010a80d:
            cmdPwdClose((cmd_pwd_t)sig_len);
            goto LAB_0010a817;
          }
          poVar8 = sig->sig + ring_len;
          local_60 = (cmd_sig_t *)(poVar8 + CONCAT44(offset._4_4_,(uint)offset));
          local_48 = cert_len_1;
          code = cmdPrivkeyRead((octet *)sig,(size_t *)0x0,*ppcVar11,(cmd_pwd_t)sig_len);
          cmdPwdClose((cmd_pwd_t)sig_len);
          if (((code == 0) && (code = cmdFileReadAll(poVar8,&offset,argv[5]), code == 0)) &&
             (code = btokCVCMatch(poVar8,CONCAT44(offset._4_4_,(uint)offset),(octet *)sig,ring_len),
             code == 0)) {
            pcVar12 = (cmd_sig_t *)(local_60->sig + local_48);
            code = cmdSigRead(pcVar12,&sig_len_4,argv[7]);
            if (code == 0) {
              if ((pcVar12->certs_len != CONCAT44(offset._4_4_,(uint)offset)) ||
                 (bVar2 = memEq(pcVar12->certs,poVar8,pcVar12->certs_len), bVar2 == 0)) {
LAB_0010a886:
                blobClose(sig);
                code = 0x203;
                goto LAB_0010a48d;
              }
              code = cmdSigVerify2(argv[7],argv[7],poVar8,CONCAT44(offset._4_4_,(uint)offset));
              if (((code == 0) &&
                  ((code = cmdFileReadAll(local_60,&cert_len_1,argv[6]), code == 0 &&
                   (code = btokCVCUnwrap((btok_cvc_t *)(local_60[1].sig + local_48),local_60->sig,
                                         cert_len_1,(octet *)0x0,0), code == 0)))) &&
                 (code = cmdFileReadAll((void *)0x0,&ring_len_2,argv[7]), code == 0)) {
                poVar8 = (octet *)blobCreate(ring_len_2);
                if (poVar8 == (octet *)0x0) {
LAB_0010a985:
                  blobClose(sig);
                  goto LAB_0010a817;
                }
                code = cmdFileReadAll(poVar8,&ring_len_2,argv[7]);
                if (code == 0) {
                  eVar5 = cmdCVCsFind((size_t *)0x0,poVar8,ring_len_2 - sig_len_4,local_60->sig,
                                      cert_len_1);
                  eVar10 = 0;
                  if (eVar5 != 0x70) {
                    eVar10 = eVar5;
                  }
                  code = 0x71;
                  if (eVar5 != 0) {
                    code = eVar10;
                  }
                  if (code == 0) {
                    buf = poVar8;
                    if ((cert_len_1 <= ring_len_2) ||
                       (buf = (octet *)blobResize(poVar8,(ring_len_2 + cert_len_1) - sig_len_4),
                       buf != (octet *)0x0)) {
                      memCopy(buf + (ring_len_2 - sig_len_4),local_60,cert_len_1);
                      code = cmdFileWrite(argv[7],buf,(ring_len_2 - sig_len_4) + cert_len_1);
                      blobClose(buf);
                      if (code == 0) {
                        bVar2 = tmDate2((octet *)&offset_1);
                        if (bVar2 == 0) goto LAB_0010a96e;
                        pcVar7 = argv[5];
                        sig_name = argv[7];
                        date = &offset_1;
                        goto LAB_00109ed7;
                      }
                      goto LAB_0010a3d8;
                    }
                    blobClose(poVar8);
                    goto LAB_0010a985;
                  }
                }
LAB_0010a874:
                blobClose(poVar8);
              }
            }
          }
LAB_0010a3d8:
          blobClose(sig);
        }
      }
    }
    else {
      iVar1 = strCmp(argv[1],"del");
      if (iVar1 == 0) {
        code = cmdStDo(8);
        if (((code == 0) && (code = 0x25b, argc == 8)) &&
           (iVar1 = strCmp(argv[2],"-pass"), iVar1 == 0)) {
          ppcVar11 = argv + 4;
          code = cmdFileValExist(4,ppcVar11);
          if ((code == 0) && (code = cmdPwdRead((cmd_pwd_t *)&sig_len,argv[3]), code == 0)) {
            ring_len = 0;
            code = cmdPrivkeyRead((octet *)0x0,&ring_len,*ppcVar11,(cmd_pwd_t)sig_len);
            if ((code == 0) &&
               ((code = cmdFileReadAll((void *)0x0,&offset,argv[5]), code == 0 &&
                (code = cmdFileReadAll((void *)0x0,&cert_len_1,argv[6]), code == 0)))) {
              sig = (cmd_sig_t *)
                    blobCreate(cert_len_1 + ring_len + CONCAT44(offset._4_4_,(uint)offset) + 0x758);
              if (sig == (cmd_sig_t *)0x0) goto LAB_0010a80d;
              poVar8 = sig->sig + ring_len;
              local_60 = (cmd_sig_t *)(poVar8 + CONCAT44(offset._4_4_,(uint)offset));
              local_48 = cert_len_1;
              code = cmdPrivkeyRead((octet *)sig,(size_t *)0x0,*ppcVar11,(cmd_pwd_t)sig_len);
              cmdPwdClose((cmd_pwd_t)sig_len);
              if (((code == 0) && (code = cmdFileReadAll(poVar8,&offset,argv[5]), code == 0)) &&
                 (code = btokCVCMatch(poVar8,CONCAT44(offset._4_4_,(uint)offset),(octet *)sig,
                                      ring_len), code == 0)) {
                pcVar12 = (cmd_sig_t *)(local_60->sig + local_48);
                code = cmdSigRead(pcVar12,&sig_len_4,argv[7]);
                if (code == 0) {
                  if ((pcVar12->certs_len != CONCAT44(offset._4_4_,(uint)offset)) ||
                     (bVar2 = memEq(pcVar12->certs,poVar8,pcVar12->certs_len), bVar2 == 0))
                  goto LAB_0010a886;
                  code = cmdSigVerify2(argv[7],argv[7],poVar8,CONCAT44(offset._4_4_,(uint)offset));
                  if (((code == 0) &&
                      (code = cmdFileReadAll(local_60,&cert_len_1,argv[6]), code == 0)) &&
                     ((code = btokCVCUnwrap((btok_cvc_t *)(local_60[1].sig + local_48),local_60->sig
                                            ,cert_len_1,(octet *)0x0,0), code == 0 &&
                      (code = cmdFileReadAll((void *)0x0,&ring_len_2,argv[7]), code == 0)))) {
                    poVar8 = (octet *)blobCreate(ring_len_2);
                    if (poVar8 == (octet *)0x0) goto LAB_0010a985;
                    code = cmdFileReadAll(poVar8,&ring_len_2,argv[7]);
                    if ((code != 0) ||
                       (code = cmdCVCsFind(&offset_1,poVar8,ring_len_2 - sig_len_4,local_60->sig,
                                           cert_len_1), code != 0)) goto LAB_0010a874;
                    memMove(poVar8 + offset_1,poVar8 + offset_1 + cert_len_1,
                            ring_len_2 - (cert_len_1 + offset_1 + sig_len_4));
                    code = cmdFileWrite(argv[7],poVar8,ring_len_2 - (sig_len_4 + cert_len_1));
                    blobClose(poVar8);
                    if (code == 0) {
                      bVar2 = tmDate2(local_36);
                      if (bVar2 == 0) goto LAB_0010a96e;
                      pcVar7 = argv[5];
                      sig_name = argv[7];
                      date = (size_t *)local_36;
                      goto LAB_00109ed7;
                    }
                  }
                }
              }
              goto LAB_0010a3d8;
            }
LAB_0010a1f1:
            cmdPwdClose((cmd_pwd_t)sig_len);
          }
        }
      }
      else {
        iVar1 = strCmp(argv[1],"val");
        if (iVar1 == 0) {
          code = cmdStDo(8);
          if ((code == 0) && (code = 0x25b, argc == 4)) {
            ppcVar11 = argv + 2;
            code = cmdFileValExist(2,ppcVar11);
            if ((code == 0) && (code = cmdFileReadAll((void *)0x0,&sig_len,*ppcVar11), code == 0)) {
              sig = (cmd_sig_t *)blobCreate(sig_len + 0x630);
              if (sig != (cmd_sig_t *)0x0) {
                pcVar12 = (cmd_sig_t *)(sig->sig + sig_len);
                code = cmdFileReadAll(sig,&sig_len,*ppcVar11);
                if ((code == 0) && (code = cmdSigRead(pcVar12,&ring_len,argv[3]), code == 0)) {
                  if (pcVar12->certs_len == sig_len) {
                    memEq(pcVar12->certs,sig,pcVar12->certs_len);
                  }
                  code = cmdSigVerify2(argv[3],argv[3],(octet *)sig,sig_len);
                  if ((code == 0) && (code = cmdFileReadAll((void *)0x0,&offset,argv[3]), code == 0)
                     ) {
                    poVar8 = (octet *)blobCreate(CONCAT44(offset._4_4_,(uint)offset));
                    if (poVar8 != (octet *)0x0) {
                      code = cmdFileReadAll(poVar8,&offset,argv[3]);
                      if (code == 0) {
                        code = cmdCVCsCheck(poVar8,CONCAT44(offset._4_4_,(uint)offset) - ring_len);
                      }
                      goto LAB_0010a874;
                    }
                    code = 0x6e;
                  }
                }
                goto LAB_0010a3d8;
              }
LAB_0010a817:
              code = 0x6e;
            }
          }
        }
        else {
          iVar1 = strCmp(argv[1],"find");
          if (iVar1 == 0) {
            code = 0x25b;
            if (argc == 4) {
              ppcVar11 = argv + 2;
              code = cmdFileValExist(2,ppcVar11);
              if (((code == 0) && (code = cmdFileReadAll((void *)0x0,&sig_len,argv[3]), code == 0))
                 && (code = cmdFileReadAll((void *)0x0,&offset,*ppcVar11), code == 0)) {
                uVar9 = 0x630;
                if (0x630 < CONCAT44(offset._4_4_,(uint)offset)) {
                  uVar9 = CONCAT44(offset._4_4_,(uint)offset);
                }
                sig = (cmd_sig_t *)blobCreate(uVar9 + sig_len);
                if (sig != (cmd_sig_t *)0x0) {
                  pcVar12 = (cmd_sig_t *)(sig->sig + sig_len);
                  code = cmdFileReadAll(sig,&sig_len,argv[3]);
                  if (((code == 0) && (code = cmdSigRead(pcVar12,&ring_len,*ppcVar11), code == 0))
                     && (code = cmdFileReadAll(pcVar12,&offset,*ppcVar11), code == 0)) {
                    code = cmdCVCsFind((size_t *)0x0,(octet *)pcVar12,
                                       CONCAT44(offset._4_4_,(uint)offset) - ring_len,(octet *)sig,
                                       sig_len);
                  }
                  goto LAB_0010a3d8;
                }
                goto LAB_0010a817;
              }
            }
          }
          else {
            iVar1 = strCmp(argv[1],"extr");
            if (iVar1 == 0) {
              code = 0x25b;
              if (argc == 5) {
                pcVar7 = argv[2];
                bVar2 = strStartsWith(pcVar7,"-cert");
                if (bVar2 != 0) {
                  sVar6 = strLen("-cert");
                  pcVar7 = pcVar7 + sVar6;
                  bVar2 = decIsValid(pcVar7);
                  if (((bVar2 != 0) && (sVar6 = strLen(pcVar7), sVar6 != 0)) &&
                     (sVar6 = strLen(pcVar7), sVar6 < 9)) {
                    uVar3 = decToU32(pcVar7);
                    ppcVar11 = argv + 3;
                    code = cmdFileValExist(1,ppcVar11);
                    if (code == 0) {
                      code = cmdFileValNotExist(1,argv + 4);
                      if ((code == 0) &&
                         (code = cmdFileReadAll((void *)0x0,&ring_len,*ppcVar11), code == 0)) {
                        sVar6 = 0x630;
                        if (0x630 < ring_len) {
                          sVar6 = ring_len;
                        }
                        local_60 = (cmd_sig_t *)blobCreate(sVar6);
                        if (local_60 != (cmd_sig_t *)0x0) {
                          code = cmdSigRead(local_60,&sig_len,*ppcVar11);
                          sig = local_60;
                          if (((code == 0) &&
                              (code = cmdFileReadAll(local_60,&ring_len,*ppcVar11), sig = local_60,
                              code == 0)) &&
                             (code = cmdCVCsGet(&offset,&cert_len_1,local_60->sig,ring_len - sig_len
                                                ,(ulong)uVar3), sig = local_60, code == 0)) {
                            code = cmdFileWrite(argv[4],local_60->sig +
                                                        CONCAT44(offset._4_4_,(uint)offset),
                                                cert_len_1);
                            sig = local_60;
                          }
                          goto LAB_0010a3d8;
                        }
                        goto LAB_0010a817;
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar1 = strCmp(argv[1],"print");
              code = 0x259;
              if (iVar1 != 0) goto LAB_0010a491;
              ppcVar11 = argv + 2;
              if (argc != 3) {
                code = 0x25b;
                if ((argc != 4) || (iVar1 = strCmp(*ppcVar11,"-certc"), iVar1 != 0))
                goto LAB_0010a48d;
                ppcVar11 = argv + 3;
              }
              code = cmdFileValExist(1,ppcVar11);
              if ((code == 0) && (code = cmdFileReadAll((void *)0x0,&ring_len,*ppcVar11), code == 0)
                 ) {
                sVar6 = 0x630;
                if (0x630 < ring_len) {
                  sVar6 = ring_len;
                }
                sig = (cmd_sig_t *)blobCreate(sVar6);
                if (sig != (cmd_sig_t *)0x0) {
                  code = cmdSigRead(sig,&sig_len,*ppcVar11);
                  if (((code == 0) && (code = cmdFileReadAll(sig,&ring_len,*ppcVar11), code == 0))
                     && (code = cmdCVCsCount(&offset,(octet *)sig,ring_len - sig_len), code == 0)) {
                    if (argc == 3) {
                      code = 0;
                      printf("certc: %u\n",(ulong)(uint)offset);
                      if (CONCAT44(offset._4_4_,(uint)offset) != 0) {
                        puts("certs:");
                        code = cmdCVCsPrint((octet *)sig,ring_len - sig_len);
                      }
                    }
                    else {
                      code = 0;
                      printf("%u\n",(ulong)(uint)offset);
                    }
                  }
                  goto LAB_0010a3d8;
                }
                goto LAB_0010a817;
              }
            }
          }
        }
      }
    }
  }
LAB_0010a48d:
  if (code == 0) {
    iVar4 = strCmp(argv[1],"val");
    if (iVar4 == 0) {
      iVar4 = 0;
      code = 0;
    }
    else {
      iVar1 = strCmp(argv[1],"find");
      iVar4 = 0;
      code = 0;
      if (iVar1 != 0) {
        return 0;
      }
    }
  }
LAB_0010a491:
  pcVar7 = errMsg(code);
  printf("bee2cmd/%s: %s\n","cvr",pcVar7);
  return iVar4;
}

Assistant:

int cvrMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return cvrUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "init"))
		code = cvrCreate(argc - 1, argv + 1);
	else if (strEq(argv[0], "add"))
		code = cvrAdd(argc - 1, argv + 1);
	else if (strEq(argv[0], "del"))
		code = cvrDel(argc - 1, argv + 1);
	else if (strEq(argv[0], "val"))
		code = cvrVal(argc - 1, argv + 1);
	else if (strEq(argv[0], "find"))
		code = cvrFind(argc - 1, argv + 1);
	else if (strEq(argv[0], "extr"))
		code = cvrExtr(argc - 1, argv + 1);
	else if (strEq(argv[0], "print"))
		code = cvrPrint(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "val") || strEq(argv[0], "find"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}